

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Misc.cpp
# Opt level: O1

void net_uv::net_adjustBuffSize(uv_handle_t *handle,int32_t minRecvBufSize,int32_t minSendBufSize)

{
  uint in_EAX;
  int32_t len;
  undefined8 uStack_28;
  
  uStack_28 = (ulong)in_EAX;
  uv_recv_buffer_size(handle,(int *)((long)&uStack_28 + 4));
  if (uStack_28._4_4_ < minRecvBufSize) {
    uStack_28 = CONCAT44(minRecvBufSize,(undefined4)uStack_28);
    uv_recv_buffer_size(handle,(int *)((long)&uStack_28 + 4));
  }
  uStack_28 = uStack_28 & 0xffffffff;
  uv_send_buffer_size(handle,(int *)((long)&uStack_28 + 4));
  if (uStack_28._4_4_ < minSendBufSize) {
    uStack_28 = CONCAT44(minSendBufSize,(undefined4)uStack_28);
    uv_send_buffer_size(handle,(int *)((long)&uStack_28 + 4));
  }
  return;
}

Assistant:

void net_adjustBuffSize(uv_handle_t* handle, int32_t minRecvBufSize, int32_t minSendBufSize)
{
	int32_t len = 0;
	int32_t r = uv_recv_buffer_size(handle, &len);
	CHECK_UV_ASSERT(r);

	if (len < minRecvBufSize)
	{
		len = minRecvBufSize;
		r = uv_recv_buffer_size(handle, &len);
		CHECK_UV_ASSERT(r);
	}

	len = 0;
	r = uv_send_buffer_size(handle, &len);
	CHECK_UV_ASSERT(r);

	if (len < minSendBufSize)
	{
		len = minSendBufSize;
		r = uv_send_buffer_size(handle, &len);
		CHECK_UV_ASSERT(r);
	}
}